

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Options::ReporterOptionParser::parseIntoConfig
          (ReporterOptionParser *this,Command *cmd,ConfigData *config)

{
  string local_30 [32];
  
  std::__cxx11::string::string
            (local_30,(string *)
                      (cmd->m_args).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::operator=((string *)config,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                config.reporter = cmd[0];
            }